

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_containsDependencyByPointer_Test::TestBody
          (AnalyserExternalVariable_containsDependencyByPointer_Test *this)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  allocator<char> local_b1;
  allocator<char> local_b0 [8];
  string local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  AssertionResult gtest_ar;
  AnalyserExternalVariablePtr externalVariable;
  AssertionResult gtest_ar_;
  VariablePtr dependency;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&externalVariable);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  externalVariable.
  super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_,
             (unsigned_long *)&externalVariable);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&externalVariable,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&externalVariable,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&externalVariable);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",local_b0);
  libcellml::ComponentEntity::component(local_a8,bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"V",&local_b1);
  libcellml::Component::variable((string *)&dependency);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&externalVariable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dependency.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",local_b0);
  libcellml::ComponentEntity::component
            (local_a8,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"Cm",&local_b1);
  libcellml::Component::variable((string *)&dependency);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::AnalyserExternalVariable::addDependency
            ((shared_ptr *)
             externalVariable.
             super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  cVar2 = libcellml::AnalyserExternalVariable::containsDependency
                    ((shared_ptr *)
                     externalVariable.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar2;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"externalVariable->containsDependency(dependency)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xbf,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar2 = libcellml::AnalyserExternalVariable::containsDependency
                    ((shared_ptr *)
                     externalVariable.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar2) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"externalVariable->containsDependency(nullptr)","true")
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xc0,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dependency.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&externalVariable.
              super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_TRUE(externalVariable->containsDependency(dependency));
    EXPECT_FALSE(externalVariable->containsDependency(nullptr));
}